

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_verify_traces.c
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  parasail_sequences_t *sequences;
  parasail_matrix_t *ppVar7;
  int *piVar8;
  int *piVar9;
  char *pcVar10;
  int *__ptr;
  ulong uVar11;
  ulong uVar12;
  gap_score_t *pgVar13;
  long *extraout_RDX;
  ulong uVar14;
  gap_score_t gVar15;
  parasail_matrix_t **pppVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  uint *puVar20;
  char **__endptr;
  long in_R8;
  undefined8 in_R9;
  long lVar21;
  int *unaff_R12;
  long lVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  parasail_function_group_t f;
  parasail_function_group_t f_00;
  parasail_function_group_t f_01;
  parasail_function_group_t f_02;
  parasail_function_group_t f_03;
  parasail_function_group_t f_04;
  parasail_function_group_t f_05;
  parasail_function_group_t f_06;
  parasail_function_group_t f_07;
  parasail_function_group_t f_08;
  parasail_function_group_t f_09;
  parasail_function_group_t f_10;
  parasail_function_group_t f_11;
  parasail_function_group_t f_12;
  parasail_function_group_t f_13;
  parasail_function_group_t f_14;
  parasail_function_group_t f_15;
  parasail_function_group_t f_16;
  parasail_function_group_t f_17;
  parasail_function_group_t f_18;
  parasail_function_group_t f_19;
  parasail_function_group_t f_20;
  parasail_function_group_t f_21;
  parasail_function_group_t f_22;
  parasail_function_group_t f_23;
  parasail_function_group_t f_24;
  parasail_function_group_t f_25;
  parasail_function_group_t f_26;
  parasail_function_group_t f_27;
  parasail_function_group_t f_28;
  parasail_function_group_t f_29;
  parasail_function_group_t f_30;
  parasail_function_group_t f_31;
  parasail_function_group_t f_32;
  parasail_function_group_t f_33;
  parasail_function_group_t f_34;
  parasail_function_group_t f_35;
  parasail_function_group_t f_36;
  parasail_function_group_t f_37;
  parasail_function_group_t f_38;
  parasail_function_group_t f_39;
  parasail_function_group_t f_40;
  parasail_function_group_t f_41;
  parasail_function_group_t f_42;
  parasail_function_group_t f_43;
  parasail_function_group_t f_44;
  parasail_function_group_t f_45;
  parasail_function_group_t f_46;
  parasail_function_group_t f_47;
  parasail_function_group_t f_48;
  parasail_function_group_t f_49;
  parasail_function_group_t f_50;
  char *endptr;
  uint uStack_180;
  uint uStack_17c;
  char **ppcStack_178;
  parasail_matrix_t *ppStack_d0;
  undefined8 uStack_c8;
  char *pcStack_b8;
  int *piStack_b0;
  int *piStack_a8;
  ulong uStack_a0;
  char **ppcStack_98;
  code *pcStack_90;
  ulong local_80;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint *local_58;
  char *local_50;
  int *local_48;
  int *local_40;
  char *local_38;
  
  local_50 = (char *)0x0;
  local_58 = (uint *)0x80000000;
  local_38 = (char *)0x0;
  local_40 = (int *)0x0;
  local_48 = (int *)0x0;
  local_80 = 0x80000000;
  local_68 = 1;
  local_64 = 1;
  local_60 = 1;
  local_5c = 1;
  local_74 = 1;
  local_70 = 1;
  local_6c = 1;
  uVar12 = 1;
LAB_0012f447:
  while( true ) {
    uVar11 = uVar12;
    pcStack_90 = (code *)0x12f458;
    uVar12 = uVar11;
    __endptr = argv;
    piVar9 = (int *)(ulong)(uint)argc;
    iVar3 = getopt(argc,argv,"f:m:n:o:e:vSi:E");
    pcVar6 = local_38;
    puVar20 = local_58;
    piVar8 = _optarg;
    iVar24 = (int)uVar11;
    if (0x52 < iVar3) break;
    if (iVar3 != 0x45) {
      if (iVar3 != -1) {
        if (iVar3 == 0x3f) {
          pcStack_90 = (code *)0x12fef6;
          main_cold_1();
        }
        goto switchD_0012f46d_caseD_2;
      }
      pcStack_b8 = local_38;
      piVar9 = local_40;
      if (local_40 != (int *)0x0) {
        pcStack_90 = (code *)0x12f686;
        sequences = (parasail_sequences_t *)parasail_sequences_from_file();
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)sequences->l;
        }
        if (local_48 != (int *)0x0) {
          pcStack_90 = (code *)0x12f6a1;
          ppVar7 = (parasail_matrix_t *)parasail_matrix_lookup();
          if (ppVar7 != (parasail_matrix_t *)0x0) goto LAB_0012f6b1;
          pcStack_90 = (code *)0x12f6ae;
          main_cold_5();
        }
        ppVar7 = (parasail_matrix_t *)0x0;
LAB_0012f6b1:
        if (pcVar6 < (char *)0x2) {
          uVar12 = 0;
        }
        else {
          uVar11 = 1;
          uVar12 = 1;
          pcVar10 = pcVar6;
          do {
            uVar12 = uVar12 * (long)pcVar10;
            pcVar10 = pcVar10 + -1;
            uVar12 = uVar12 / uVar11;
            uVar11 = uVar11 + 1;
          } while (uVar11 != 3);
        }
        pcStack_90 = (code *)0x12f6fd;
        printf("%lu choose 2 is %lu\n",pcVar6,uVar12);
        if (local_68 != 0) {
          pcStack_90 = (code *)0x12f70f;
          iVar3 = parasail_can_use_sse2();
          if (iVar24 != 0 && iVar3 != 0) {
            uVar11 = local_80 & 0xffffffff;
            if (local_74 != 0) {
              pcStack_90 = (code *)0x12f757;
              f.fs = parasail_nw_trace_sse2_functions;
              f.name = "parasail_nw_trace_sse2";
              check_functions(f,sequences,uVar12,ppVar7,
                              (gap_score_t)(uVar11 + ((long)puVar20 << 0x20)));
            }
            if (local_70 != 0) {
              gVar15 = (gap_score_t)(uVar11 + ((long)puVar20 << 0x20));
              pcStack_90 = (code *)0x12f78c;
              f_00.fs = parasail_sg_trace_sse2_functions;
              f_00.name = "parasail_sg_trace_sse2";
              check_functions(f_00,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f7ab;
              f_01.fs = parasail_sg_qb_trace_sse2_functions;
              f_01.name = "parasail_sg_qb_trace_sse2";
              check_functions(f_01,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f7ca;
              f_02.fs = parasail_sg_qe_trace_sse2_functions;
              f_02.name = "parasail_sg_qe_trace_sse2";
              check_functions(f_02,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f7e9;
              f_03.fs = parasail_sg_qx_trace_sse2_functions;
              f_03.name = "parasail_sg_qx_trace_sse2";
              check_functions(f_03,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f808;
              f_04.fs = parasail_sg_db_trace_sse2_functions;
              f_04.name = "parasail_sg_db_trace_sse2";
              check_functions(f_04,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f827;
              f_05.fs = parasail_sg_de_trace_sse2_functions;
              f_05.name = "parasail_sg_de_trace_sse2";
              check_functions(f_05,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f846;
              f_06.fs = parasail_sg_dx_trace_sse2_functions;
              f_06.name = "parasail_sg_dx_trace_sse2";
              check_functions(f_06,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f865;
              f_07.fs = parasail_sg_qb_de_trace_sse2_functions;
              f_07.name = "parasail_sg_qb_de_trace_sse2";
              check_functions(f_07,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f884;
              f_08.fs = parasail_sg_qe_db_trace_sse2_functions;
              f_08.name = "parasail_sg_qe_db_trace_sse2";
              check_functions(f_08,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f8a3;
              f_09.fs = parasail_sg_qb_db_trace_sse2_functions;
              f_09.name = "parasail_sg_qb_db_trace_sse2";
              check_functions(f_09,sequences,uVar12,ppVar7,gVar15);
              puVar20 = local_58;
              pcStack_90 = (code *)0x12f8c7;
              f_10.fs = parasail_sg_qe_de_trace_sse2_functions;
              f_10.name = "parasail_sg_qe_de_trace_sse2";
              check_functions(f_10,sequences,uVar12,ppVar7,gVar15);
            }
            if (local_6c != 0) {
              pcStack_90 = (code *)0x12f8f7;
              f_11.fs = parasail_sw_trace_sse2_functions;
              f_11.name = "parasail_sw_trace_sse2";
              check_functions(f_11,sequences,uVar12,ppVar7,
                              (gap_score_t)(uVar11 | (long)puVar20 << 0x20));
            }
          }
        }
        if (local_64 != 0) {
          pcStack_90 = (code *)0x12f909;
          iVar3 = parasail_can_use_sse41();
          if (iVar24 != 0 && iVar3 != 0) {
            if (local_74 != 0) {
              pcStack_90 = (code *)0x12f951;
              f_12.fs = parasail_nw_trace_sse41_functions;
              f_12.name = "parasail_nw_trace_sse41";
              check_functions(f_12,sequences,uVar12,ppVar7,
                              (gap_score_t)(local_80 & 0xffffffff | (long)puVar20 << 0x20));
            }
            if (local_70 != 0) {
              gVar15 = (gap_score_t)(local_80 & 0xffffffff | (long)puVar20 << 0x20);
              pcStack_90 = (code *)0x12f989;
              f_13.fs = parasail_sg_trace_sse41_functions;
              f_13.name = "parasail_sg_trace_sse41";
              check_functions(f_13,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f9a8;
              f_14.fs = parasail_sg_qb_trace_sse41_functions;
              f_14.name = "parasail_sg_qb_trace_sse41";
              check_functions(f_14,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f9c7;
              f_15.fs = parasail_sg_qe_trace_sse41_functions;
              f_15.name = "parasail_sg_qe_trace_sse41";
              check_functions(f_15,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12f9e6;
              f_16.fs = parasail_sg_qx_trace_sse41_functions;
              f_16.name = "parasail_sg_qx_trace_sse41";
              check_functions(f_16,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fa05;
              f_17.fs = parasail_sg_db_trace_sse41_functions;
              f_17.name = "parasail_sg_db_trace_sse41";
              check_functions(f_17,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fa24;
              f_18.fs = parasail_sg_de_trace_sse41_functions;
              f_18.name = "parasail_sg_de_trace_sse41";
              check_functions(f_18,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fa43;
              f_19.fs = parasail_sg_dx_trace_sse41_functions;
              f_19.name = "parasail_sg_dx_trace_sse41";
              check_functions(f_19,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fa62;
              f_20.fs = parasail_sg_qb_de_trace_sse41_functions;
              f_20.name = "parasail_sg_qb_de_trace_sse41";
              check_functions(f_20,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fa81;
              f_21.fs = parasail_sg_qe_db_trace_sse41_functions;
              f_21.name = "parasail_sg_qe_db_trace_sse41";
              check_functions(f_21,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12faa0;
              f_22.fs = parasail_sg_qb_db_trace_sse41_functions;
              f_22.name = "parasail_sg_qb_db_trace_sse41";
              check_functions(f_22,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fabf;
              f_23.fs = parasail_sg_qe_de_trace_sse41_functions;
              f_23.name = "parasail_sg_qe_de_trace_sse41";
              check_functions(f_23,sequences,uVar12,ppVar7,gVar15);
            }
            if (local_6c != 0) {
              pcStack_90 = (code *)0x12faf1;
              f_24.fs = parasail_sw_trace_sse41_functions;
              f_24.name = "parasail_sw_trace_sse41";
              check_functions(f_24,sequences,uVar12,ppVar7,
                              (gap_score_t)(local_80 & 0xffffffff | (long)puVar20 << 0x20));
            }
          }
        }
        if (local_60 != 0) {
          pcStack_90 = (code *)0x12fb03;
          iVar3 = parasail_can_use_avx2();
          if (iVar24 != 0 && iVar3 != 0) {
            if (local_74 != 0) {
              pcStack_90 = (code *)0x12fb4b;
              f_25.fs = parasail_nw_trace_avx2_functions;
              f_25.name = "parasail_nw_trace_avx2";
              check_functions(f_25,sequences,uVar12,ppVar7,
                              (gap_score_t)(local_80 & 0xffffffff | (long)puVar20 << 0x20));
            }
            if (local_70 != 0) {
              gVar15 = (gap_score_t)(local_80 & 0xffffffff | (long)puVar20 << 0x20);
              pcStack_90 = (code *)0x12fb83;
              f_26.fs = parasail_sg_trace_avx2_functions;
              f_26.name = "parasail_sg_trace_avx2";
              check_functions(f_26,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fba2;
              f_27.fs = parasail_sg_qb_trace_avx2_functions;
              f_27.name = "parasail_sg_qb_trace_avx2";
              check_functions(f_27,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fbc1;
              f_28.fs = parasail_sg_qe_trace_avx2_functions;
              f_28.name = "parasail_sg_qe_trace_avx2";
              check_functions(f_28,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fbe0;
              f_29.fs = parasail_sg_qx_trace_avx2_functions;
              f_29.name = "parasail_sg_qx_trace_avx2";
              check_functions(f_29,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fbff;
              f_30.fs = parasail_sg_db_trace_avx2_functions;
              f_30.name = "parasail_sg_db_trace_avx2";
              check_functions(f_30,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fc1e;
              f_31.fs = parasail_sg_de_trace_avx2_functions;
              f_31.name = "parasail_sg_de_trace_avx2";
              check_functions(f_31,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fc3d;
              f_32.fs = parasail_sg_dx_trace_avx2_functions;
              f_32.name = "parasail_sg_dx_trace_avx2";
              check_functions(f_32,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fc5c;
              f_33.fs = parasail_sg_qb_de_trace_avx2_functions;
              f_33.name = "parasail_sg_qb_de_trace_avx2";
              check_functions(f_33,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fc7b;
              f_34.fs = parasail_sg_qe_db_trace_avx2_functions;
              f_34.name = "parasail_sg_qe_db_trace_avx2";
              check_functions(f_34,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fc9a;
              f_35.fs = parasail_sg_qb_db_trace_avx2_functions;
              f_35.name = "parasail_sg_qb_db_trace_avx2";
              check_functions(f_35,sequences,uVar12,ppVar7,gVar15);
              pcStack_90 = (code *)0x12fcb9;
              f_36.fs = parasail_sg_qe_de_trace_avx2_functions;
              f_36.name = "parasail_sg_qe_de_trace_avx2";
              check_functions(f_36,sequences,uVar12,ppVar7,gVar15);
            }
            if (local_6c != 0) {
              pcStack_90 = (code *)0x12fceb;
              f_37.fs = parasail_sw_trace_avx2_functions;
              f_37.name = "parasail_sw_trace_avx2";
              check_functions(f_37,sequences,uVar12,ppVar7,
                              (gap_score_t)(local_80 & 0xffffffff | (long)puVar20 << 0x20));
            }
          }
        }
        if (iVar24 != 0 && local_5c != 0) {
          if (local_74 != 0) {
            pcStack_90 = (code *)0x12fd36;
            f_38.fs = parasail_nw_trace_disp_functions;
            f_38.name = "parasail_nw_trace_disp";
            check_functions(f_38,sequences,uVar12,ppVar7,
                            (gap_score_t)(local_80 & 0xffffffff | (long)puVar20 << 0x20));
          }
          if (local_70 != 0) {
            gVar15 = (gap_score_t)(local_80 & 0xffffffff | (long)puVar20 << 0x20);
            pcStack_90 = (code *)0x12fd6e;
            f_39.fs = parasail_sg_trace_disp_functions;
            f_39.name = "parasail_sg_trace_disp";
            check_functions(f_39,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fd8d;
            f_40.fs = parasail_sg_qb_trace_disp_functions;
            f_40.name = "parasail_sg_qb_trace_disp";
            check_functions(f_40,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fdac;
            f_41.fs = parasail_sg_qe_trace_disp_functions;
            f_41.name = "parasail_sg_qe_trace_disp";
            check_functions(f_41,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fdcb;
            f_42.fs = parasail_sg_qx_trace_disp_functions;
            f_42.name = "parasail_sg_qx_trace_disp";
            check_functions(f_42,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fdea;
            f_43.fs = parasail_sg_db_trace_disp_functions;
            f_43.name = "parasail_sg_db_trace_disp";
            check_functions(f_43,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fe09;
            f_44.fs = parasail_sg_de_trace_disp_functions;
            f_44.name = "parasail_sg_de_trace_disp";
            check_functions(f_44,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fe28;
            f_45.fs = parasail_sg_dx_trace_disp_functions;
            f_45.name = "parasail_sg_dx_trace_disp";
            check_functions(f_45,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fe47;
            f_46.fs = parasail_sg_qb_de_trace_disp_functions;
            f_46.name = "parasail_sg_qb_de_trace_disp";
            check_functions(f_46,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fe66;
            f_47.fs = parasail_sg_qe_db_trace_disp_functions;
            f_47.name = "parasail_sg_qe_db_trace_disp";
            check_functions(f_47,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fe85;
            f_48.fs = parasail_sg_qb_db_trace_disp_functions;
            f_48.name = "parasail_sg_qb_db_trace_disp";
            check_functions(f_48,sequences,uVar12,ppVar7,gVar15);
            pcStack_90 = (code *)0x12fea4;
            f_49.fs = parasail_sg_qe_de_trace_disp_functions;
            f_49.name = "parasail_sg_qe_de_trace_disp";
            check_functions(f_49,sequences,uVar12,ppVar7,gVar15);
          }
          if (local_6c != 0) {
            pcStack_90 = (code *)0x12fed3;
            f_50.fs = parasail_sw_trace_disp_functions;
            f_50.name = "parasail_sw_trace_disp";
            check_functions(f_50,sequences,uVar12,ppVar7,
                            (gap_score_t)(local_80 & 0xffffffff | (long)puVar20 << 0x20));
          }
        }
        pcStack_90 = (code *)0x12fedb;
        parasail_sequences_free(sequences);
        return 0;
      }
      goto LAB_0012ff0a;
    }
    exit_on_mismatch = '\x01';
    uVar12 = uVar11;
  }
  uVar12 = (ulong)(iVar3 - 0x65);
  switch(uVar12) {
  case 0:
    pcStack_90 = (code *)0x12f474;
    unaff_R12 = __errno_location();
    *unaff_R12 = 0;
    __endptr = &local_50;
    pcStack_90 = (code *)0x12f496;
    piVar9 = _optarg;
    local_58 = (uint *)strtol((char *)_optarg,__endptr,10);
    uVar12 = uVar11;
    if (*unaff_R12 != 0) goto LAB_0012fefb;
    goto LAB_0012f447;
  case 1:
    local_40 = _optarg;
    uVar12 = uVar11;
    goto LAB_0012f447;
  case 2:
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0012f46d_caseD_2;
  case 4:
    pcStack_90 = (code *)0x12f5aa;
    pcVar6 = strstr((char *)_optarg,"sse2");
    local_68 = (uint)(pcVar6 == (char *)0x0);
    pcStack_90 = (code *)0x12f5c5;
    pcVar6 = strstr((char *)piVar8,"sse41");
    local_64 = (uint)(pcVar6 == (char *)0x0);
    pcStack_90 = (code *)0x12f5e0;
    pcVar6 = strstr((char *)piVar8,"avx2");
    local_60 = (uint)(pcVar6 == (char *)0x0);
    pcStack_90 = (code *)0x12f5fb;
    pcVar6 = strstr((char *)piVar8,"disp");
    local_5c = (uint)(pcVar6 == (char *)0x0);
    pcStack_90 = (code *)0x12f616;
    pcVar6 = strstr((char *)piVar8,"nw");
    local_74 = (uint)(pcVar6 == (char *)0x0);
    pcStack_90 = (code *)0x12f631;
    pcVar6 = strstr((char *)piVar8,"sg");
    local_70 = (uint)(pcVar6 == (char *)0x0);
    pcStack_90 = (code *)0x12f64c;
    pcVar6 = strstr((char *)piVar8,"sw");
    local_6c = (uint)(pcVar6 == (char *)0x0);
    uVar12 = uVar11;
    unaff_R12 = piVar8;
    goto LAB_0012f447;
  case 8:
    local_48 = _optarg;
    uVar12 = uVar11;
    goto LAB_0012f447;
  case 9:
    pcStack_90 = (code *)0x12f557;
    unaff_R12 = __errno_location();
    *unaff_R12 = 0;
    __endptr = &local_50;
    pcStack_90 = (code *)0x12f579;
    piVar9 = _optarg;
    local_38 = (char *)strtol((char *)_optarg,__endptr,10);
    uVar12 = uVar11;
    if (*unaff_R12 != 0) goto LAB_0012ff05;
    goto LAB_0012f447;
  case 10:
    break;
  default:
    uVar12 = 0;
    if (iVar3 == 0x53) goto LAB_0012f447;
    if (iVar3 == 0x76) {
      verbose = 1;
      uVar12 = uVar11;
      goto LAB_0012f447;
    }
switchD_0012f46d_caseD_2:
    pcStack_90 = (code *)0x12fefb;
    main_cold_7();
LAB_0012fefb:
    pcStack_90 = (code *)0x12ff00;
    main_cold_2();
    goto LAB_0012ff00;
  }
  pcStack_90 = (code *)0x12f518;
  unaff_R12 = __errno_location();
  *unaff_R12 = 0;
  __endptr = &local_50;
  pcStack_90 = (code *)0x12f53a;
  piVar9 = _optarg;
  local_80 = strtol((char *)_optarg,__endptr,10);
  uVar12 = uVar11;
  if (*unaff_R12 != 0) goto LAB_0012ff00;
  goto LAB_0012f447;
LAB_0012ff00:
  pcStack_90 = (code *)0x12ff05;
  main_cold_3();
LAB_0012ff05:
  pcStack_90 = (code *)0x12ff0a;
  main_cold_4();
  pcStack_b8 = "f:m:n:o:e:vSi:E";
  puVar20 = &switchD_0012f46d::switchdataD_00131010;
LAB_0012ff0a:
  pcStack_90 = check_functions;
  main_cold_6();
  uStack_c8 = 0;
  pppVar16 = parasail_matrices;
  if (in_R8 != 0) {
    pppVar16 = &ppStack_d0;
  }
  piStack_b0 = unaff_R12;
  piStack_a8 = (int *)(ulong)(uint)argc;
  uStack_a0 = uVar11;
  ppcStack_98 = argv;
  pcStack_90 = (code *)puVar20;
  uVar4 = printf("checking %s functions\n",piVar9);
  uVar11 = (ulong)uVar4;
  ppVar7 = *pppVar16;
  if (ppVar7 == (parasail_matrix_t *)0x0) {
LAB_001304dc:
    return (int)uVar11;
  }
  uVar4 = (uint)((ulong)in_R9 >> 0x20);
  uVar11 = 0;
LAB_0012ffb8:
  pcVar6 = ppVar7->name;
  if (verbose == 1) {
    printf("\t%s\n",pcVar6);
  }
  pgVar13 = gap_scores;
  lVar19 = 0;
  uVar5 = gap_scores[0].open;
  do {
    uStack_180 = uVar4;
    uStack_17c = (uint)in_R9;
    if (uVar4 == 0x80000000) {
      uStack_180 = pgVar13->extend;
      uStack_17c = uVar5;
    }
    if (verbose == 1) {
      printf("\t\topen=%d extend=%d ref=%s\n",(ulong)uStack_17c,(ulong)uStack_180,__endptr[1]);
    }
    if (__endptr[9] != (char *)0x0) {
      pcVar2 = (code *)*__endptr;
      lVar25 = 1;
      ppcStack_178 = __endptr + 9;
      do {
        if (verbose == 1) {
          printf("\t\t\t%s\n",ppcStack_178[1]);
        }
        lVar21 = 0;
        if (0 < (long)uVar12) {
          uVar23 = 0;
          do {
            dVar29 = (double)(long)uVar23;
            dVar30 = dVar29 + dVar29;
            if (dVar30 < 0.0) {
              dVar30 = sqrt(dVar30);
            }
            else {
              dVar30 = SQRT(dVar30);
            }
            dVar31 = floor(dVar30);
            dVar30 = 1.0;
            if (1.0 <= dVar31 + -1.0) {
              dVar30 = dVar31 + -1.0;
            }
            dVar31 = (dVar30 + -1.0) * dVar30 * 0.5;
            for (; dVar32 = dVar29 - dVar31, dVar30 <= dVar32; dVar30 = dVar30 + 1.0) {
              dVar31 = dVar31 + dVar30;
            }
            uVar26 = (long)dVar32 >> 0x3f & (long)(dVar32 - 9.223372036854776e+18) | (long)dVar32;
            uVar27 = (long)dVar30 >> 0x3f & (long)(dVar30 - 9.223372036854776e+18) | (long)dVar30;
            lVar17 = uVar26 * 0x40;
            uVar14 = *(ulong *)(*extraout_RDX + 0x20 + lVar17);
            lVar22 = uVar27 * 0x40;
            uVar18 = *(ulong *)(*extraout_RDX + 0x20 + lVar22);
            if (verbose == 1) {
              printf("\t\t\t\tpair=%lld (%lu,%lu)\n",uVar23,uVar26,uVar27);
            }
            piVar8 = (int *)(*pcVar2)(*(undefined8 *)(*extraout_RDX + 0x28 + lVar17),
                                      uVar14 & 0xffffffff,
                                      *(undefined8 *)(*extraout_RDX + 0x28 + lVar22),
                                      uVar18 & 0xffffffff,uStack_17c,uStack_180,ppVar7);
            piVar9 = (int *)(*(code *)*ppcStack_178)
                                      (*(undefined8 *)(*extraout_RDX + 0x28 + lVar17),uVar14,
                                       *(undefined8 *)(*extraout_RDX + 0x28 + lVar22),
                                       uVar18 & 0xffffffff,uStack_17c,uStack_180,ppVar7);
            iVar3 = parasail_result_is_saturated(piVar9);
            if (iVar3 == 0) {
              pcVar10 = (char *)parasail_result_get_trace_table(piVar8);
              lVar17 = parasail_result_get_trace_table(piVar9);
              if ((*piVar8 != *piVar9) &&
                 (printf("%s(%lu,%lu,%d,%d,%s) wrong score (%d!=%d)\n",ppcStack_178[1],uVar26,uVar27
                         ,(ulong)uStack_17c,(ulong)uStack_180,pcVar6,*piVar8,*piVar9),
                 exit_on_mismatch == '\x01')) goto LAB_001304ee;
              uVar18 = uVar18 * uVar14;
              if (((byte)((uint)piVar9[3] >> 0x13) & (piVar9[3] & 0xc00U) != 0) == 0) {
                if (uVar18 != 0) {
                  lVar22 = 0;
                  do {
                    if (pcVar10[lVar22] != *(char *)(lVar17 + lVar22)) goto LAB_001303bd;
                    lVar22 = lVar22 + 1;
                  } while (uVar18 - lVar22 != 0);
                }
              }
              else {
                __ptr = (int *)parasail_striped_unwind();
                bVar28 = uVar18 != 0;
                if (uVar18 == 0) {
LAB_001303a8:
                  free(__ptr);
                }
                else if (*__ptr == (int)*pcVar10) {
                  uVar14 = 0;
                  do {
                    if (uVar18 - 1 == uVar14) {
                      bVar28 = false;
                      goto LAB_001303a8;
                    }
                    lVar17 = uVar14 + 1;
                    uVar1 = uVar14 + 1;
                    lVar22 = uVar14 + 1;
                    uVar14 = uVar1;
                  } while (__ptr[lVar22] == (int)pcVar10[lVar17]);
                  bVar28 = uVar1 < uVar18;
                }
                if (bVar28) {
LAB_001303bd:
                  printf("%s(%lu,%lu,%d,%d,%s) bad trace table\n",ppcStack_178[1],uVar26,uVar27,
                         (ulong)uStack_17c,(ulong)uStack_180,pcVar6);
                  if (exit_on_mismatch == '\x01') goto LAB_001304ee;
                }
              }
              parasail_result_free(piVar8);
              parasail_result_free(piVar9);
            }
            else {
              parasail_result_free(piVar8);
              parasail_result_free(piVar9);
              lVar21 = lVar21 + 1;
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar12);
        }
        if (((lVar21 != 0 & verbose) == 1) &&
           (printf("%s %d %d %s saturated %lu times\n",ppcStack_178[1],(ulong)uStack_17c,
                   (ulong)uStack_180,pcVar6), exit_on_mismatch == '\x01')) {
LAB_001304ee:
          exit(1);
        }
        lVar25 = lVar25 + 1;
        ppcStack_178 = __endptr + lVar25 * 9;
      } while (*ppcStack_178 != (char *)0x0);
    }
    if (uVar4 != 0x80000000) break;
    pgVar13 = gap_scores + lVar19 + 1;
    lVar19 = lVar19 + 1;
    uVar5 = pgVar13->open;
  } while( true );
  ppVar7 = pppVar16[uVar11 + 1];
  uVar11 = uVar11 + 1;
  if (ppVar7 == (parasail_matrix_t *)0x0) goto LAB_001304dc;
  goto LAB_0012ffb8;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned long seq_count = 0;
    unsigned long limit = 0;
    parasail_sequences_t *sequences = NULL;
    char *endptr = NULL;
    char *filename = NULL;
    int c = 0;
    int test_scores = 1;
    char *matrixname = NULL;
    const parasail_matrix_t *matrix = NULL;
    gap_score_t gap = {INT_MIN,INT_MIN};
    int do_sse2 = 1;
    int do_sse41 = 1;
    int do_avx2 = 1;
    int do_altivec = 1;
    int do_neon = 1;
    int do_disp = 1;
    int do_nw = 1;
    int do_sg = 1;
    int do_sw = 1;

    while ((c = getopt(argc, argv, "f:m:n:o:e:vSi:E")) != -1) {
        switch (c) {
            case 'f':
                filename = optarg;
                break;
            case 'm':
                matrixname = optarg;
                break;
            case 'n':
                errno = 0;
                seq_count = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol");
                    exit(1);
                }
                break;
            case 'o':
                errno = 0;
                gap.open = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol gap.open");
                    exit(1);
                }
                break;
            case 'e':
                errno = 0;
                gap.extend = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol gap.extend");
                    exit(1);
                }
                break;
            case 'v':
                verbose = 1;
                break;
            case 'E':
                exit_on_mismatch = 1;
                break;
            case 'S':
                test_scores = 0;
                break;
            case 'i':
                do_sse2 = (NULL == strstr(optarg, "sse2"));
                do_sse41 = (NULL == strstr(optarg, "sse41"));
                do_avx2 = (NULL == strstr(optarg, "avx2"));
                do_altivec = (NULL == strstr(optarg, "altivec"));
                do_neon = (NULL == strstr(optarg, "neon"));
                do_disp = (NULL == strstr(optarg, "disp"));
                do_nw = (NULL == strstr(optarg, "nw"));
                do_sg = (NULL == strstr(optarg, "sg"));
                do_sw = (NULL == strstr(optarg, "sw"));
                break;
            case '?':
                if (optopt == 'f' || optopt == 'n') {
                    fprintf(stderr,
                            "Option -%c requires an argument.\n",
                            optopt);
                }
                else if (isprint(optopt)) {
                    fprintf(stderr, "Unknown option `-%c'.\n",
                            optopt);
                }
                else {
                    fprintf(stderr,
                            "Unknown option character `\\x%x'.\n",
                            optopt);
                }
                exit(1);
            default:
                fprintf(stderr, "default case in getopt\n");
                exit(1);
        }
    }

    if (filename) {
        sequences = parasail_sequences_from_file(filename);
        if (0 == seq_count) {
            seq_count = sequences->l;
        }
    }
    else {
        fprintf(stderr, "no filename specified\n");
        exit(1);
    }

    /* select the matrix */
    if (matrixname) {
        matrix = parasail_matrix_lookup(matrixname);
        if (NULL == matrix) {
            fprintf(stderr, "Specified substitution matrix not found.\n");
            exit(1);
        }
    }

    limit = binomial_coefficient(seq_count, 2);
    printf("%lu choose 2 is %lu\n", seq_count, limit);

#if HAVE_SSE2
    if (do_sse2 && parasail_can_use_sse2()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_sse2, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_SSE41
    if (do_sse41 && parasail_can_use_sse41()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_sse41, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_AVX2
    if (do_avx2 && parasail_can_use_avx2()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_avx2, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_ALTIVEC
    if (do_altivec && parasail_can_use_altivec()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_altivec, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_NEON
    if (do_neon && parasail_can_use_neon()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_neon, sequences, limit, matrix, gap);
        }
    }
#endif

    if (do_disp) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_disp, sequences, limit, matrix, gap);
        }
    }

    parasail_sequences_free(sequences);

    return 0;
}